

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::ComputeOutputDir
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *out)

{
  TargetType TVar1;
  pointer pcVar2;
  size_type sVar3;
  cmGlobalGenerator *pcVar4;
  cmMakefile *pcVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  _Alloc_hider _Var10;
  _Alloc_hider _Var11;
  cmGeneratorExpression ge;
  size_type __dnew;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string targetTypeName;
  string conf;
  string configPropStr;
  string propertyNameStr;
  string configUpper;
  
  conf._M_dataplus._M_p = (pointer)&conf.field_2;
  pcVar2 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&conf,pcVar2,pcVar2 + config->_M_string_length);
  pcVar7 = GetOutputTargetType(this,artifact);
  targetTypeName._M_dataplus._M_p = (pointer)&targetTypeName.field_2;
  sVar8 = strlen(pcVar7);
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetTypeName,pcVar7,pcVar7 + sVar8);
  propertyNameStr._M_dataplus._M_p = (pointer)&propertyNameStr.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&propertyNameStr,targetTypeName._M_dataplus._M_p,
             targetTypeName._M_dataplus._M_p + targetTypeName._M_string_length);
  if (propertyNameStr._M_string_length == 0) {
    _Var11._M_p = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&propertyNameStr);
    _Var11 = propertyNameStr._M_dataplus;
  }
  cmsys::SystemTools::UpperCase(&configUpper,&conf);
  configPropStr._M_dataplus._M_p = (pointer)&configPropStr.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&configPropStr,targetTypeName._M_dataplus._M_p,
             targetTypeName._M_dataplus._M_p + targetTypeName._M_string_length);
  if (configPropStr._M_string_length == 0) {
    _Var10._M_p = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&configPropStr);
    std::__cxx11::string::_M_append((char *)&configPropStr,(ulong)configUpper._M_dataplus._M_p);
    _Var10 = configPropStr._M_dataplus;
  }
  std::__cxx11::string::string((string *)&ge,_Var10._M_p,(allocator *)&__dnew);
  pcVar7 = GetProperty(this,(string *)&ge);
  if (ge.Backtrace.Bottom.State != (cmState *)&ge.Backtrace.Bottom.Position.Position) {
    operator_delete(ge.Backtrace.Bottom.State,ge.Backtrace.Bottom.Position.Position + 1);
  }
  if (pcVar7 == (char *)0x0) {
    std::__cxx11::string::string((string *)&ge,_Var11._M_p,(allocator *)&__dnew);
    pcVar7 = GetProperty(this,(string *)&ge);
    if (ge.Backtrace.Bottom.State != (cmState *)&ge.Backtrace.Bottom.Position.Position) {
      operator_delete(ge.Backtrace.Bottom.State,ge.Backtrace.Bottom.Position.Position + 1);
    }
    if (pcVar7 == (char *)0x0) {
      TVar1 = this->Target->TargetTypeValue;
      if (TVar1 - STATIC_LIBRARY < 3) {
        pcVar5 = this->Makefile;
        ge.Backtrace.Bottom.State = (cmState *)&ge.Backtrace.Bottom.Position.Position;
        __dnew = 0x13;
        ge.Backtrace.Bottom.State =
             (cmState *)std::__cxx11::string::_M_create((ulong *)&ge,(ulong)&__dnew);
        ge.Backtrace.Bottom.Position.Position = __dnew;
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x0 = 'L';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x1 = 'I';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x2 = 'B';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x3 = 'R';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x4 = 'A';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x5 = 'R';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x6 = 'Y';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x7 = '_';
        *(undefined8 *)
         &((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header.
          _M_header = 0x505f54555054554f;
        *(undefined4 *)
         &((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header.
          _M_header.field_0x7 = 0x48544150;
        ge.Backtrace.Bottom.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)__dnew;
        (&((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x0)[__dnew] = 0;
        pcVar9 = cmMakefile::GetSafeDefinition(pcVar5,(string *)&ge);
        pcVar7 = (char *)out->_M_string_length;
        strlen(pcVar9);
        std::__cxx11::string::_M_replace((ulong)out,0,pcVar7,(ulong)pcVar9);
      }
      else {
        if (TVar1 != EXECUTABLE) goto LAB_003a2326;
        pcVar5 = this->Makefile;
        ge.Backtrace.Bottom.State = (cmState *)&ge.Backtrace.Bottom.Position.Position;
        __dnew = 0x16;
        ge.Backtrace.Bottom.State =
             (cmState *)std::__cxx11::string::_M_create((ulong *)&ge,(ulong)&__dnew);
        ge.Backtrace.Bottom.Position.Position = __dnew;
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x0 = 'E';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x1 = 'X';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x2 = 'E';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x3 = 'C';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x4 = 'U';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x5 = 'T';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x6 = 'A';
        ((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x7 = 'B';
        *(undefined8 *)
         &((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header.
          _M_header = 0x555054554f5f454c;
        *(undefined8 *)
         &((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header.
          _M_header.field_0x6 = 0x485441505f545550;
        ge.Backtrace.Bottom.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)__dnew;
        (&((ge.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.field_0x0)[__dnew] = 0;
        pcVar9 = cmMakefile::GetSafeDefinition(pcVar5,(string *)&ge);
        pcVar7 = (char *)out->_M_string_length;
        strlen(pcVar9);
        std::__cxx11::string::_M_replace((ulong)out,0,pcVar7,(ulong)pcVar9);
      }
      if (ge.Backtrace.Bottom.State != (cmState *)&ge.Backtrace.Bottom.Position.Position) {
        operator_delete(ge.Backtrace.Bottom.State,ge.Backtrace.Bottom.Position.Position + 1);
      }
      goto LAB_003a2326;
    }
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__dnew);
    cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&__dnew);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__dnew);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&__dnew,(char *)&ge);
    cge.x_ = (cmCompiledGeneratorExpression *)__dnew;
    __dnew = 0;
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&__dnew);
    local_f8 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
    local_f0._M_local_buf[0] = '\0';
    __dnew = (size_type)&local_f0;
    pcVar9 = cmCompiledGeneratorExpression::Evaluate
                       (cge.x_,this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (string *)&__dnew);
    pcVar7 = (char *)out->_M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)out,0,pcVar7,(ulong)pcVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != &local_f0) {
      operator_delete((void *)__dnew,
                      CONCAT62(local_f0._M_allocated_capacity._2_6_,
                               CONCAT11(local_f0._M_local_buf[1],local_f0._M_local_buf[0])) + 1);
    }
    iVar6 = std::__cxx11::string::compare((char *)out);
    if (iVar6 != 0) {
      std::__cxx11::string::_M_replace((ulong)&conf,0,(char *)conf._M_string_length,0x59b99e);
    }
  }
  else {
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__dnew);
    cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&__dnew);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__dnew);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&__dnew,(char *)&ge);
    cge.x_ = (cmCompiledGeneratorExpression *)__dnew;
    __dnew = 0;
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&__dnew);
    local_f8 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
    local_f0._M_local_buf[0] = '\0';
    __dnew = (size_type)&local_f0;
    pcVar9 = cmCompiledGeneratorExpression::Evaluate
                       (cge.x_,this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (string *)&__dnew);
    pcVar7 = (char *)out->_M_string_length;
    strlen(pcVar9);
    std::__cxx11::string::_M_replace((ulong)out,0,pcVar7,(ulong)pcVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != &local_f0) {
      operator_delete((void *)__dnew,
                      CONCAT62(local_f0._M_allocated_capacity._2_6_,
                               CONCAT11(local_f0._M_local_buf[1],local_f0._M_local_buf[0])) + 1);
    }
    std::__cxx11::string::_M_replace((ulong)&conf,0,(char *)conf._M_string_length,0x59b99e);
  }
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
LAB_003a2326:
  sVar3 = out->_M_string_length;
  if (sVar3 == 0) {
    std::__cxx11::string::_M_replace((ulong)out,0,(char *)0x0,0x577279);
  }
  pcVar7 = cmLocalGenerator::GetCurrentBinaryDirectory(this->LocalGenerator);
  cmsys::SystemTools::CollapseFullPath((string *)&ge,out,pcVar7);
  std::__cxx11::string::operator=((string *)out,(string *)&ge);
  if (ge.Backtrace.Bottom.State != (cmState *)&ge.Backtrace.Bottom.Position.Position) {
    operator_delete(ge.Backtrace.Bottom.State,ge.Backtrace.Bottom.Position.Position + 1);
  }
  if (conf._M_string_length != 0) {
    iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x23])
                      (this->GlobalGenerator,this->Makefile);
    pcVar7 = "";
    if ((sVar3 == 0 & (byte)iVar6) != 0) {
      pcVar7 = "${EFFECTIVE_PLATFORM_NAME}";
    }
    ge.Backtrace.Bottom.State = (cmState *)&ge.Backtrace.Bottom.Position.Position;
    pcVar9 = pcVar7 + 0x1a;
    if ((sVar3 == 0 & (byte)iVar6) == 0) {
      pcVar9 = pcVar7;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&ge,pcVar7,pcVar9);
    pcVar4 = this->LocalGenerator->GlobalGenerator;
    local_f0._M_local_buf[0] = '/';
    local_f0._M_local_buf[1] = '\0';
    local_f8 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x1;
    __dnew = (size_type)&local_f0;
    (*pcVar4->_vptr_cmGlobalGenerator[0x12])(pcVar4,&__dnew,&conf,&ge,out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != &local_f0) {
      operator_delete((void *)__dnew,
                      CONCAT62(local_f0._M_allocated_capacity._2_6_,
                               CONCAT11(local_f0._M_local_buf[1],local_f0._M_local_buf[0])) + 1);
    }
    if (ge.Backtrace.Bottom.State != (cmState *)&ge.Backtrace.Bottom.Position.Position) {
      operator_delete(ge.Backtrace.Bottom.State,ge.Backtrace.Bottom.Position.Position + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configPropStr._M_dataplus._M_p != &configPropStr.field_2) {
    operator_delete(configPropStr._M_dataplus._M_p,configPropStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configUpper._M_dataplus._M_p != &configUpper.field_2) {
    operator_delete(configUpper._M_dataplus._M_p,configUpper.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)propertyNameStr._M_dataplus._M_p != &propertyNameStr.field_2) {
    operator_delete(propertyNameStr._M_dataplus._M_p,
                    propertyNameStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetTypeName._M_dataplus._M_p != &targetTypeName.field_2) {
    operator_delete(targetTypeName._M_dataplus._M_p,targetTypeName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)conf._M_dataplus._M_p != &conf.field_2) {
    operator_delete(conf._M_dataplus._M_p,conf.field_2._M_allocated_capacity + 1);
  }
  return sVar3 == 0;
}

Assistant:

bool cmGeneratorTarget::ComputeOutputDir(const std::string& config,
                                         cmStateEnums::ArtifactType artifact,
                                         std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(artifact);
  const char* propertyName = CM_NULLPTR;
  std::string propertyNameStr = targetTypeName;
  if (!propertyNameStr.empty()) {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
  }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = CM_NULLPTR;
  std::string configPropStr = targetTypeName;
  if (!configPropStr.empty()) {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
  }

  // Select an output directory.
  if (const char* config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(config_outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory.
    conf = "";
  } else if (const char* outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != outdir) {
      conf = "";
    }
  } else if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
  } else if (this->GetType() == cmStateEnums::STATIC_LIBRARY ||
             this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
  }
  if (out.empty()) {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    bool useEPN =
      this->GlobalGenerator->UseEffectivePlatformName(this->Makefile);
    std::string suffix =
      usesDefaultOutputDir && useEPN ? "${EFFECTIVE_PLATFORM_NAME}" : "";
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, suffix, out);
  }

  return usesDefaultOutputDir;
}